

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.cpp
# Opt level: O2

XMLNode * __thiscall ORPG::Core::XMLNode::insert_first_child(XMLNode *this,XMLNode *node)

{
  XMLNode *pXVar1;
  
  pXVar1 = insert_before_node(this,this->firstChild,node);
  return pXVar1;
}

Assistant:

XMLNode* XMLNode::insert_first_child(XMLNode* node) {
    return insert_before_node(first_child(), node);
}